

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

IGeneratorTracker * __thiscall
Catch::RunContext::createGeneratorTracker
          (RunContext *this,StringRef generatorName,SourceLineInfo lineInfo,
          GeneratorBasePtr *generator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ITracker *pIVar3;
  GeneratorUntypedBase *pGVar4;
  long *plVar5;
  bool bVar6;
  ITracker *pIVar7;
  GeneratorTracker *temp;
  unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker> newTracker;
  unique_ptr<Catch::TestCaseTracking::ITracker> local_88;
  NameAndLocation local_80;
  unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker> local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_50.m_ptr = (GeneratorTracker *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,generatorName.m_start,generatorName.m_start + generatorName.m_size)
  ;
  paVar2 = &local_80.name.field_2;
  if (local_50.m_ptr == (GeneratorTracker *)&local_40) {
    local_80.name.field_2._8_8_ = local_40._8_8_;
    local_80.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_80.name._M_dataplus._M_p = (pointer)local_50.m_ptr;
  }
  local_80.name.field_2._M_allocated_capacity = local_40._M_allocated_capacity;
  local_80.name._M_string_length = local_48;
  pIVar3 = (this->m_trackerContext).m_currentTracker;
  local_80.location.file = lineInfo.file;
  local_80.location.line = lineInfo.line;
  bVar6 = TestCaseTracking::operator==(&pIVar3->m_nameAndLocation,&local_80);
  if (!bVar6) {
    pIVar7 = (ITracker *)operator_new(0x78);
    pIVar7->_vptr_ITracker = (_func_int **)&PTR__ITracker_00323e58;
    paVar1 = &(pIVar7->m_nameAndLocation).name.field_2;
    (pIVar7->m_nameAndLocation).name._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.name._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity = local_80.name.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(pIVar7->m_nameAndLocation).name.field_2 + 8) =
           local_80.name.field_2._8_8_;
    }
    else {
      (pIVar7->m_nameAndLocation).name._M_dataplus._M_p = local_80.name._M_dataplus._M_p;
      (pIVar7->m_nameAndLocation).name.field_2._M_allocated_capacity =
           local_80.name.field_2._M_allocated_capacity;
    }
    (pIVar7->m_nameAndLocation).name._M_string_length = local_80.name._M_string_length;
    local_80.name._M_string_length = 0;
    local_80.name.field_2._M_allocated_capacity =
         local_80.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    (pIVar7->m_nameAndLocation).location.file = local_80.location.file;
    (pIVar7->m_nameAndLocation).location.line = local_80.location.line;
    pIVar7->m_parent = pIVar3;
    (pIVar7->m_children).
    super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar7->m_children).
    super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pIVar7->m_children).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(pIVar7->m_children).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    pIVar7[1]._vptr_ITracker = (_func_int **)&this->m_trackerContext;
    pIVar7->_vptr_ITracker = (_func_int **)&PTR__GeneratorTracker_00326958;
    pIVar7[1].m_nameAndLocation.name._M_dataplus._M_p = (pointer)&PTR__GeneratorTracker_003269b8;
    pIVar7[1].m_nameAndLocation.name._M_string_length = 0;
    local_50.m_ptr = (GeneratorTracker *)0x0;
    local_88.m_ptr = pIVar7;
    local_80.name._M_dataplus._M_p = (pointer)paVar2;
    std::
    vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>
    ::emplace_back<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>
              ((vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>
                *)&pIVar3->m_children,&local_88);
    if (local_88.m_ptr != (ITracker *)0x0) {
      (*(local_88.m_ptr)->_vptr_ITracker[1])();
    }
    pGVar4 = generator->m_ptr;
    generator->m_ptr = (GeneratorUntypedBase *)0x0;
    plVar5 = (long *)pIVar7[1].m_nameAndLocation.name._M_string_length;
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x18))();
    }
    pIVar7[1].m_nameAndLocation.name._M_string_length = (size_type)pGVar4;
    pIVar7->m_runState = Executing;
    pIVar7[1]._vptr_ITracker[1] = (_func_int *)pIVar7;
    if (pIVar7->m_parent != (ITracker *)0x0) {
      TestCaseTracking::ITracker::openChild(pIVar7->m_parent);
    }
    Detail::unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker>::~unique_ptr
              (&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.name._M_dataplus._M_p != paVar2) {
      operator_delete(local_80.name._M_dataplus._M_p,local_80.name.field_2._M_allocated_capacity + 1
                     );
    }
    return (IGeneratorTracker *)&pIVar7[1].m_nameAndLocation;
  }
  __assert_fail("currentTracker.nameAndLocation() != nameAndLoc && \"Trying to create tracker for a genreator that already has one\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0x1524,
                "virtual IGeneratorTracker *Catch::RunContext::createGeneratorTracker(StringRef, SourceLineInfo, Generators::GeneratorBasePtr &&)"
               );
}

Assistant:

IGeneratorTracker* RunContext::createGeneratorTracker(
        StringRef generatorName,
        SourceLineInfo lineInfo,
        Generators::GeneratorBasePtr&& generator ) {

        auto nameAndLoc = TestCaseTracking::NameAndLocation( static_cast<std::string>( generatorName ), lineInfo );
        auto& currentTracker = m_trackerContext.currentTracker();
        assert(
            currentTracker.nameAndLocation() != nameAndLoc &&
            "Trying to create tracker for a genreator that already has one" );

        auto newTracker = Catch::Detail::make_unique<Generators::GeneratorTracker>(
            CATCH_MOVE(nameAndLoc), m_trackerContext, &currentTracker );
        auto ret = newTracker.get();
        currentTracker.addChild( CATCH_MOVE( newTracker ) );

        ret->setGenerator( CATCH_MOVE( generator ) );
        ret->open();
        return ret;
    }